

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int copy_front(flatcc_emitter_t *E,uint8_t *data,size_t size)

{
  int iVar1;
  size_t local_30;
  size_t k;
  size_t size_local;
  uint8_t *data_local;
  flatcc_emitter_t *E_local;
  
  size_local = (size_t)(data + size);
  k = size;
  do {
    while( true ) {
      if (k == 0) {
        return 0;
      }
      local_30 = k;
      if ((E->front_left < k) && (local_30 = E->front_left, local_30 == 0)) break;
      E->front_cursor = E->front_cursor + -local_30;
      E->front_left = E->front_left - local_30;
      size_local = size_local - local_30;
      k = k - local_30;
      memcpy(E->front_cursor,(void *)size_local,local_30);
    }
    iVar1 = advance_front(E);
  } while (iVar1 == 0);
  return -1;
}

Assistant:

static int copy_front(flatcc_emitter_t *E, uint8_t *data, size_t size)
{
    size_t k;

    data += size;
    while (size) {
        k = size;
        if (k > E->front_left) {
            k = E->front_left;
            if (k == 0) {
                if (advance_front(E)) {
                    return -1;
                }
                continue;
            }
        }
        E->front_cursor -= k;
        E->front_left -= k;
        data -= k;
        size -= k;
        memcpy(E->front_cursor, data, k);
    };
    return 0;
}